

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

void __thiscall xemmai::t_list::f_resize(t_list *this)

{
  long lVar1;
  t_object *ptVar2;
  __pointer_type ptVar3;
  size_t sVar4;
  t_type *ptVar5;
  t_queue<128UL> *ptVar6;
  t_queue<256UL> *ptVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  t_object *ptVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  t_value<xemmai::t_slot> *this_00;
  char *pcVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  uVar14 = this->v_size * 8 + 0xcf;
  uVar12 = uVar14 & 0xffffffffffffff80;
  uVar15 = uVar12 * 2 - 0x50 >> 3;
  this->v_grow = uVar15;
  uVar13 = 0;
  uVar11 = (uVar12 >> 1) - 0x50 >> 3;
  if (uVar14 < 0x100) {
    uVar11 = uVar13;
  }
  this->v_shrink = uVar11;
  ptVar3 = (this->v_tuple).v_p._M_b._M_p;
  ptVar10 = t_heap<xemmai::t_object>::f_allocate_medium
                      ((t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30),
                       uVar12 * 4 - 0x50);
  ptVar10->v_next = (t_object *)0x0;
  *(ulong *)ptVar10->v_data = uVar15;
  uVar14 = *(ulong *)ptVar3->v_data;
  uVar11 = this->v_head;
  if (uVar14 < this->v_size + uVar11) {
    this_00 = (t_value<xemmai::t_slot> *)(ptVar10->v_data + 8);
    uVar13 = 0;
    do {
      uVar13 = uVar13 + 1;
      this->v_head = uVar11 + 1;
      t_value<xemmai::t_slot>::t_value
                (this_00,(t_value<xemmai::t_slot> *)(ptVar3->v_data + uVar11 * 0x10 + 8));
      uVar11 = this->v_head;
      this_00 = this_00 + 1;
    } while (uVar11 < uVar14);
    this->v_head = 0;
  }
  pcVar16 = ptVar10->v_data + uVar13 * 0x10 + 0x18;
  uVar14 = uVar13 + 1;
  do {
    uVar13 = uVar13 + 1;
    sVar4 = this->v_head;
    this->v_head = sVar4 + 1;
    t_value<xemmai::t_slot>::t_value
              ((t_value<xemmai::t_slot> *)(pcVar16 + -0x10),
               (t_value<xemmai::t_slot> *)(ptVar3->v_data + sVar4 * 0x10 + 8));
    auVar9 = _DAT_0018ca20;
    auVar8 = _DAT_0018ca10;
    pcVar16 = pcVar16 + 0x10;
    uVar14 = uVar14 + 1;
  } while (uVar13 < this->v_size);
  if (uVar14 < this->v_grow) {
    uVar14 = this->v_grow;
  }
  lVar1 = (uVar14 - uVar13) + -1;
  auVar17._8_4_ = (int)lVar1;
  auVar17._0_8_ = lVar1;
  auVar17._12_4_ = (int)((ulong)lVar1 >> 0x20);
  uVar11 = 0;
  auVar17 = auVar17 ^ _DAT_0018ca20;
  do {
    auVar18._8_4_ = (int)uVar11;
    auVar18._0_8_ = uVar11;
    auVar18._12_4_ = (int)(uVar11 >> 0x20);
    auVar18 = (auVar18 | auVar8) ^ auVar9;
    if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                auVar17._4_4_ < auVar18._4_4_) & 1)) {
      pcVar16[-0x10] = '\0';
      pcVar16[-0xf] = '\0';
      pcVar16[-0xe] = '\0';
      pcVar16[-0xd] = '\0';
      pcVar16[-0xc] = '\0';
      pcVar16[-0xb] = '\0';
      pcVar16[-10] = '\0';
      pcVar16[-9] = '\0';
    }
    if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
        auVar18._12_4_ <= auVar17._12_4_) {
      pcVar16[0] = '\0';
      pcVar16[1] = '\0';
      pcVar16[2] = '\0';
      pcVar16[3] = '\0';
      pcVar16[4] = '\0';
      pcVar16[5] = '\0';
      pcVar16[6] = '\0';
      pcVar16[7] = '\0';
    }
    uVar11 = uVar11 + 2;
    pcVar16 = pcVar16 + 0x20;
  } while (((uVar14 - uVar13) + 1 & 0xfffffffffffffffe) != uVar11);
  ptVar5 = *(t_type **)(*(long *)(in_FS_OFFSET + -0x78) + 0x1a8);
  ptVar6 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *ptVar6->v_head = (t_object *)&ptVar5[-1].f_less;
  if (ptVar6->v_head == ptVar6->v_next) {
    t_slot::t_queue<128UL>::f_next(ptVar6);
  }
  else {
    ptVar6->v_head = ptVar6->v_head + 1;
  }
  ptVar10->v_type = ptVar5;
  ptVar7 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *ptVar7->v_head = ptVar10;
  if (ptVar7->v_head == ptVar7->v_next) {
    t_slot::t_queue<256UL>::f_next(ptVar7);
  }
  else {
    ptVar7->v_head = ptVar7->v_head + 1;
  }
  if ((t_object *)0x4 < ptVar10) {
    ptVar6 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *ptVar6->v_head = ptVar10;
    if (ptVar6->v_head == ptVar6->v_next) {
      t_slot::t_queue<128UL>::f_next(ptVar6);
    }
    else {
      ptVar6->v_head = ptVar6->v_head + 1;
    }
  }
  LOCK();
  ptVar2 = (this->v_tuple).v_p._M_b._M_p;
  (this->v_tuple).v_p._M_b._M_p = ptVar10;
  UNLOCK();
  if ((t_object *)0x4 < ptVar2) {
    ptVar7 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *ptVar7->v_head = ptVar2;
    if (ptVar7->v_head == ptVar7->v_next) {
      t_slot::t_queue<256UL>::f_next(ptVar7);
    }
    else {
      ptVar7->v_head = ptVar7->v_head + 1;
    }
  }
  this->v_head = 0;
  return;
}

Assistant:

void t_list::f_resize()
{
	auto size = t_object::f_capacity_to_size<t_tuple, t_slot>(v_size);
	v_grow = t_object::f_size_to_capacity<t_tuple, t_slot>(size * 2);
	v_shrink = size < sizeof(t_object) * 2 ? 0 : t_object::f_size_to_capacity<t_tuple, t_slot>(size / 2);
	auto& tuple0 = v_tuple->f_as<t_tuple>();
	v_tuple = t_tuple::f_instantiate(v_grow, [&](auto& tuple1)
	{
		size_t n = tuple0.f_size();
		size_t i = 0;
		if (v_head + v_size > n) {
			do new(&tuple1[i++]) t_svalue(tuple0[v_head++]); while (v_head < n);
			v_head = 0;
		}
		do new(&tuple1[i++]) t_svalue(tuple0[v_head++]); while (i < v_size);
		do new(&tuple1[i++]) t_svalue; while (i < v_grow);
	});
	v_head = 0;
}